

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPM2B_PRIVATE_Unmarshal(TPM2B_PRIVATE *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT16_Unmarshal((UINT16 *)target,buffer,size);
  if (TVar1 == 0) {
    TVar1 = 0x95;
    if ((target->t).size < 0x38f) {
      TVar1 = BYTE_Array_Unmarshal((target->t).buffer,buffer,size,(uint)(target->t).size);
      return TVar1;
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPM2B_PRIVATE_Unmarshal(TPM2B_PRIVATE *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT16_Unmarshal((UINT16 *)&(target->t.size), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if((target->t.size) > sizeof(_PRIVATE))
        return TPM_RC_SIZE;
    result = BYTE_Array_Unmarshal((BYTE *)(target->t.buffer), buffer, size, (INT32)(target->t.size));
    return result;
}